

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent.c
# Opt level: O3

int libssh2_agent_sign(LIBSSH2_AGENT *agent,libssh2_agent_publickey *identity,uchar **sig,
                      size_t *s_len,uchar *data,size_t d_len,char *method,uint method_len)

{
  LIBSSH2_SESSION *pLVar1;
  uint32_t uVar2;
  int iVar3;
  uchar *__dest;
  LIBSSH2_AGENT *local_38;
  
  if (agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
    *(undefined8 *)&(agent->transctx).state = 0;
    (agent->transctx).send_recv_total = 0;
    (agent->transctx).response = (uchar *)0x0;
    (agent->transctx).response_len = 0;
    (agent->transctx).request = (uchar *)0x0;
    (agent->transctx).request_len = 0;
    agent->identity = (agent_publickey *)identity->node;
  }
  iVar3 = -0x26;
  if (3 < identity->blob_len) {
    local_38 = agent;
    uVar2 = _libssh2_ntohu32(identity->blob);
    if ((ulong)uVar2 + 4 <= identity->blob_len) {
      pLVar1 = agent->session;
      pLVar1->userauth_pblc_method_len = (ulong)method_len;
      __dest = (uchar *)(*pLVar1->alloc)((ulong)method_len,&pLVar1->abstract);
      agent->session->userauth_pblc_method = __dest;
      memcpy(__dest,method,(ulong)uVar2);
      iVar3 = agent_sign(agent->session,sig,s_len,data,d_len,&local_38);
      pLVar1 = agent->session;
      (*pLVar1->free)(pLVar1->userauth_pblc_method,&pLVar1->abstract);
      pLVar1 = agent->session;
      pLVar1->userauth_pblc_method = (uchar *)0x0;
      pLVar1->userauth_pblc_method_len = 0;
    }
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_agent_sign(LIBSSH2_AGENT *agent,
                   struct libssh2_agent_publickey *identity,
                   unsigned char **sig,
                   size_t *s_len,
                   const unsigned char *data,
                   size_t d_len,
                   const char *method,
                   unsigned int method_len)
{
    void *abstract = agent;
    int rc;
    uint32_t methodLen;

    if(agent->session->userauth_pblc_state == libssh2_NB_state_idle) {
        memset(&agent->transctx, 0, sizeof(agent->transctx));
        agent->identity = identity->node;
    }

    if(identity->blob_len < sizeof(uint32_t)) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }

    methodLen = _libssh2_ntohu32(identity->blob);

    if(identity->blob_len < sizeof(uint32_t) + methodLen) {
        return LIBSSH2_ERROR_BUFFER_TOO_SMALL;
    }

    agent->session->userauth_pblc_method_len = method_len;
    agent->session->userauth_pblc_method = LIBSSH2_ALLOC(agent->session,
                                                         method_len);

    memcpy(agent->session->userauth_pblc_method, method, methodLen);

    rc = agent_sign(agent->session, sig, s_len, data, d_len, &abstract);

    LIBSSH2_FREE(agent->session, agent->session->userauth_pblc_method);
    agent->session->userauth_pblc_method = NULL;
    agent->session->userauth_pblc_method_len = 0;

    return rc;
}